

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

void __thiscall QRhiWidgetPrivate::resetColorBufferObjects(QRhiWidgetPrivate *this)

{
  long in_FS_OFFSET;
  QRhiTexture *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->colorTexture != (QRhiTexture *)0x0) {
    local_20 = this->colorTexture;
    QtPrivate::QPodArrayOps<QRhiResource*>::emplace<QRhiResource*&>
              ((QPodArrayOps<QRhiResource*> *)&this->pendingDeletes,(this->pendingDeletes).d.size,
               (QRhiResource **)&local_20);
    QList<QRhiResource_*>::end(&this->pendingDeletes);
    this->colorTexture = (QRhiTexture *)0x0;
  }
  if ((QRhiTexture *)this->msaaColorBuffer != (QRhiTexture *)0x0) {
    local_20 = (QRhiTexture *)this->msaaColorBuffer;
    QtPrivate::QPodArrayOps<QRhiResource*>::emplace<QRhiResource*&>
              ((QPodArrayOps<QRhiResource*> *)&this->pendingDeletes,(this->pendingDeletes).d.size,
               (QRhiResource **)&local_20);
    QList<QRhiResource_*>::end(&this->pendingDeletes);
    this->msaaColorBuffer = (QRhiRenderBuffer *)0x0;
  }
  if (this->resolveTexture != (QRhiTexture *)0x0) {
    local_20 = this->resolveTexture;
    QtPrivate::QPodArrayOps<QRhiResource*>::emplace<QRhiResource*&>
              ((QPodArrayOps<QRhiResource*> *)&this->pendingDeletes,(this->pendingDeletes).d.size,
               (QRhiResource **)&local_20);
    QList<QRhiResource_*>::end(&this->pendingDeletes);
    this->resolveTexture = (QRhiTexture *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiWidgetPrivate::resetColorBufferObjects()
{
    if (colorTexture) {
        pendingDeletes.append(colorTexture);
        colorTexture = nullptr;
    }
    if (msaaColorBuffer) {
        pendingDeletes.append(msaaColorBuffer);
        msaaColorBuffer = nullptr;
    }
    if (resolveTexture) {
        pendingDeletes.append(resolveTexture);
        resolveTexture = nullptr;
    }
}